

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O3

void __thiscall
TEST_MockCallTest_shouldReturnDefaultWhenThereIsntAnythingToReturn_Test::testBody
          (TEST_MockCallTest_shouldReturnDefaultWhenThereIsntAnythingToReturn_Test *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  MockSupport *pMVar3;
  TestTerminator *pTVar4;
  SimpleString SStack_d8;
  SimpleString local_c8;
  MockNamedValue local_b8;
  MockNamedValue local_68;
  
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_c8,"");
  pMVar3 = mock(&local_c8,(MockFailureReporter *)0x0);
  (*pMVar3->_vptr_MockSupport[8])(&local_68,pMVar3);
  SimpleString::SimpleString(&SStack_d8,"");
  MockNamedValue::MockNamedValue(&local_b8,&SStack_d8);
  bVar1 = MockNamedValue::equals(&local_68,&local_b8);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","mock().returnValue().equals(MockNamedValue(\"\"))",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
             ,0x1dc,pTVar4);
  MockNamedValue::~MockNamedValue(&local_b8);
  SimpleString::~SimpleString(&SStack_d8);
  MockNamedValue::~MockNamedValue(&local_68);
  SimpleString::~SimpleString(&local_c8);
  return;
}

Assistant:

TEST(MockCallTest, shouldReturnDefaultWhenThereIsntAnythingToReturn)
{
    CHECK(mock().returnValue().equals(MockNamedValue("")));
}